

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  size_t in_RSI;
  undefined8 *puVar5;
  _Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_> *this;
  byte bVar6;
  jthread listener_thread;
  jthread listener2_thread;
  jthread producer_thread;
  Queue<(anonymous_namespace)::Action> queue;
  ListenerTask listener_task;
  ProducerTask producer_task;
  ListenerTaskTwo listener_task2;
  jthread local_9e10;
  jthread local_9e00;
  long *local_9df0;
  jthread local_9de8;
  long *local_9dd8;
  long *local_9dd0;
  undefined8 local_9dc8;
  undefined8 uStack_9dc0;
  undefined8 local_9db8;
  undefined8 uStack_9db0;
  undefined8 local_9da8;
  undefined8 local_9da0;
  Semaphore local_9d98;
  Semaphore local_9d30;
  anon_union_5000_2_650ea050_for_random_device_0 local_9cc8 [2];
  long **local_75b0;
  undefined1 local_75a8 [32];
  RandomElementGetter local_7588;
  RandomElementGetter local_4e70;
  long **local_2758;
  RandomElementGetter local_2750;
  long **local_38;
  
  bVar6 = 0;
  local_7588.rd.field_0._M_mt._M_x[4] = 0;
  local_7588.rd.field_0._M_mt._M_x[5] = 0;
  local_7588.rd.field_0._M_mt._M_x[2] = 0;
  local_7588.rd.field_0._M_mt._M_x[3] = 0;
  local_7588.rd.field_0.field_0._M_file = (_Elt_pointer)0x0;
  local_7588.rd.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  local_75a8._16_4_ = 0;
  local_75a8._20_4_ = 0;
  local_75a8._24_4_ = 0;
  local_75a8._28_4_ = 0;
  local_75a8._0_8_ = (_Map_pointer)0x0;
  local_75a8._8_4_ = 0;
  local_75a8._12_4_ = 0;
  std::_Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>::
  _M_initialize_map((_Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
                     *)local_75a8,in_RSI);
  local_9dd8 = (long *)operator_new(0x10);
  *(undefined4 *)(local_9dd8 + 1) = 1;
  *local_9dd8 = (long)&PTR_pop_00106bc8;
  plVar3 = (long *)operator_new(0x58);
  *plVar3 = (long)&PTR_pop_front_00106c80;
  this = (_Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
          *)(plVar3 + 1);
  plVar3[1] = 0;
  plVar3[2] = 0;
  plVar3[3] = 0;
  plVar3[4] = 0;
  plVar3[5] = 0;
  plVar3[6] = 0;
  plVar3[7] = 0;
  plVar3[8] = 0;
  plVar3[9] = 0;
  plVar3[10] = 0;
  std::_Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>::
  _M_initialize_map(this,in_RSI);
  if ((_Map_pointer)local_75a8._0_8_ != (_Map_pointer)0x0) {
    local_9cc8[0]._0_8_ = (this->_M_impl).super__Deque_impl_data._M_map;
    local_9cc8[0]._8_8_ = plVar3[2];
    lVar1 = plVar3[3];
    lVar2 = plVar3[4];
    local_7588.rd.field_0.field_0._M_file = (void *)plVar3[5];
    local_7588.rd.field_0.field_0._M_func = (_func_result_type_void_ptr *)plVar3[6];
    local_7588.rd.field_0._M_mt._M_x[2] = plVar3[7];
    local_7588.rd.field_0._M_mt._M_x[3] = plVar3[8];
    local_7588.rd.field_0._M_mt._M_x[4] = plVar3[9];
    local_7588.rd.field_0._M_mt._M_x[5] = plVar3[10];
    puVar5 = (undefined8 *)local_75a8;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      (this->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)*puVar5;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      this = (_Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
              *)((long)this + ((ulong)bVar6 * -2 + 1) * 8);
    }
    local_75a8._8_4_ = (undefined4)local_9cc8[0]._8_8_;
    local_75a8._12_4_ = (undefined4)((ulong)local_9cc8[0]._8_8_ >> 0x20);
    local_75a8._16_4_ = (undefined4)lVar1;
    local_75a8._20_4_ = (undefined4)((ulong)lVar1 >> 0x20);
    local_75a8._24_4_ = (undefined4)lVar2;
    local_75a8._28_4_ = (undefined4)((ulong)lVar2 >> 0x20);
    local_75a8._0_8_ = local_9cc8[0]._0_8_;
  }
  local_9dc8 = 0;
  uStack_9dc0 = 0;
  local_9db8 = 0;
  uStack_9db0 = 0;
  local_9da8 = 0;
  local_9da0 = 100;
  local_9dd0 = plVar3;
  sem::Semaphore::Semaphore(&local_9d98,100,0);
  sem::Semaphore::Semaphore(&local_9d30,100,100);
  std::deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>::~deque
            ((deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_> *
             )local_75a8);
  local_75a8._16_4_ = 4;
  local_75a8._20_4_ = 5;
  local_75a8._24_4_ = 6;
  local_75a8._0_8_ = (_Map_pointer)0x100000000;
  local_75a8._8_4_ = 2;
  local_75a8._12_4_ = 3;
  anon_unknown.dwarf_9b41::RandomElementGetter::RandomElementGetter(&local_7588,3,1);
  anon_unknown.dwarf_9b41::RandomElementGetter::RandomElementGetter(&local_4e70,7,0);
  local_2758 = &local_9dd8;
  anon_unknown.dwarf_9b41::RandomElementGetter::RandomElementGetter
            ((RandomElementGetter *)&local_9cc8[0].field_0,5,1);
  local_75b0 = &local_9dd8;
  anon_unknown.dwarf_9b41::RandomElementGetter::RandomElementGetter(&local_2750,6,3);
  local_38 = &local_9dd8;
  local_9de8._M_stop_source._M_state._M_ptr = (_Stop_state_ref)operator_new(0x18);
  ((_Stop_state_t *)local_9de8._M_stop_source._M_state._M_ptr)->_M_owners =
       (__atomic_base<unsigned_int>)0x0;
  ((_Stop_state_t *)local_9de8._M_stop_source._M_state._M_ptr)->_M_value =
       (__atomic_base<unsigned_int>)0x0;
  ((_Stop_state_t *)local_9de8._M_stop_source._M_state._M_ptr)->_M_head = (_Stop_cb *)0x0;
  (((_Stop_state_t *)local_9de8._M_stop_source._M_state._M_ptr)->_M_requester)._M_thread = 0;
  ((_Stop_state_t *)local_9de8._M_stop_source._M_state._M_ptr)->_M_owners =
       (__atomic_base<unsigned_int>)0x1;
  ((_Stop_state_t *)local_9de8._M_stop_source._M_state._M_ptr)->_M_value =
       (__atomic_base<unsigned_int>)0x4;
  ((_Stop_state_t *)local_9de8._M_stop_source._M_state._M_ptr)->_M_head = (_Stop_cb *)0x0;
  (((_Stop_state_t *)local_9de8._M_stop_source._M_state._M_ptr)->_M_requester)._M_thread = 0;
  local_9de8._M_thread._M_id._M_thread = (id)0;
  local_9e10._M_stop_source._M_state._M_ptr = (_Stop_state_ref)operator_new(0x10);
  *(undefined ***)local_9e10._M_stop_source._M_state._M_ptr = &PTR___State_00106d00;
  ((_Stop_state_t *)local_9e10._M_stop_source._M_state._M_ptr)->_M_head = (_Stop_cb *)local_75a8;
  std::thread::_M_start_thread(&local_9de8._M_thread,&local_9e10,0);
  if (local_9e10._M_stop_source._M_state._M_ptr != (_Stop_state_t *)0x0) {
    (**(code **)(*(long *)local_9e10._M_stop_source._M_state._M_ptr + 8))();
  }
  local_9e10._M_stop_source._M_state._M_ptr = (_Stop_state_ref)operator_new(0x18);
  ((_Stop_state_t *)local_9e10._M_stop_source._M_state._M_ptr)->_M_owners =
       (__atomic_base<unsigned_int>)0x0;
  ((_Stop_state_t *)local_9e10._M_stop_source._M_state._M_ptr)->_M_value =
       (__atomic_base<unsigned_int>)0x0;
  ((_Stop_state_t *)local_9e10._M_stop_source._M_state._M_ptr)->_M_head = (_Stop_cb *)0x0;
  (((_Stop_state_t *)local_9e10._M_stop_source._M_state._M_ptr)->_M_requester)._M_thread = 0;
  ((_Stop_state_t *)local_9e10._M_stop_source._M_state._M_ptr)->_M_owners =
       (__atomic_base<unsigned_int>)0x1;
  ((_Stop_state_t *)local_9e10._M_stop_source._M_state._M_ptr)->_M_value =
       (__atomic_base<unsigned_int>)0x4;
  ((_Stop_state_t *)local_9e10._M_stop_source._M_state._M_ptr)->_M_head = (_Stop_cb *)0x0;
  (((_Stop_state_t *)local_9e10._M_stop_source._M_state._M_ptr)->_M_requester)._M_thread = 0;
  local_9e10._M_thread._M_id._M_thread = (id)0;
  local_9e00._M_stop_source._M_state._M_ptr = (_Stop_state_ref)operator_new(0x10);
  *(undefined ***)local_9e00._M_stop_source._M_state._M_ptr = &PTR___State_00106d40;
  ((_Stop_state_t *)local_9e00._M_stop_source._M_state._M_ptr)->_M_head = (_Stop_cb *)local_9cc8;
  std::thread::_M_start_thread(&local_9e10._M_thread,&local_9e00,0);
  if (local_9e00._M_stop_source._M_state._M_ptr != (_Stop_state_t *)0x0) {
    (**(code **)(*(long *)local_9e00._M_stop_source._M_state._M_ptr + 8))();
  }
  local_9e00._M_stop_source._M_state._M_ptr = (_Stop_state_ref)operator_new(0x18);
  ((_Stop_state_t *)local_9e00._M_stop_source._M_state._M_ptr)->_M_owners =
       (__atomic_base<unsigned_int>)0x0;
  ((_Stop_state_t *)local_9e00._M_stop_source._M_state._M_ptr)->_M_value =
       (__atomic_base<unsigned_int>)0x0;
  ((_Stop_state_t *)local_9e00._M_stop_source._M_state._M_ptr)->_M_head = (_Stop_cb *)0x0;
  (((_Stop_state_t *)local_9e00._M_stop_source._M_state._M_ptr)->_M_requester)._M_thread = 0;
  ((_Stop_state_t *)local_9e00._M_stop_source._M_state._M_ptr)->_M_owners =
       (__atomic_base<unsigned_int>)0x1;
  ((_Stop_state_t *)local_9e00._M_stop_source._M_state._M_ptr)->_M_value =
       (__atomic_base<unsigned_int>)0x4;
  ((_Stop_state_t *)local_9e00._M_stop_source._M_state._M_ptr)->_M_head = (_Stop_cb *)0x0;
  (((_Stop_state_t *)local_9e00._M_stop_source._M_state._M_ptr)->_M_requester)._M_thread = 0;
  local_9e00._M_thread._M_id._M_thread = (id)0;
  local_9df0 = (long *)operator_new(0x10);
  *local_9df0 = (long)&PTR___State_00106d80;
  local_9df0[1] = (long)&local_2750;
  std::thread::_M_start_thread(&local_9e00._M_thread,&local_9df0,0);
  if (local_9df0 != (long *)0x0) {
    (**(code **)(*local_9df0 + 8))();
  }
  std::jthread::~jthread(&local_9e00);
  std::jthread::~jthread(&local_9e10);
  std::jthread::~jthread(&local_9de8);
  std::random_device::_M_fini();
  std::random_device::_M_fini();
  std::random_device::_M_fini();
  std::random_device::_M_fini();
  std::condition_variable::~condition_variable(&local_9d30.cv);
  std::condition_variable::~condition_variable(&local_9d98.cv);
  if (local_9dd0 != (long *)0x0) {
    (**(code **)(*local_9dd0 + 0x40))();
  }
  local_9dd0 = (long *)0x0;
  if (local_9dd8 != (long *)0x0) {
    (**(code **)(*local_9dd8 + 0x30))();
  }
  return 0;
}

Assistant:

int main() {
    mq::Queue queue{std::deque<Action>{}, 100};  // NOLINT
    ProducerTask producer_task{queue};
    ListenerTask listener_task{queue};
    ListenerTaskTwo listener_task2{queue};

    std::jthread producer_thread{std::ref(producer_task)};
    std::jthread listener_thread{std::ref(listener_task)};
    std::jthread listener2_thread{std::ref(listener_task2)};
}